

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LevelTest_TestLevelMonitoringLowBitrate_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::LevelTest_TestLevelMonitoringLowBitrate_Test>
           *this)

{
  LevelTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int>>::
  parameter_ = &this->parameter_;
  this_00 = (LevelTest *)operator_new(0x480);
  anon_unknown.dwarf_18f8d8c::LevelTest::LevelTest(this_00);
  (this_00->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__LevelTest_01088d70;
  (this_00->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__LevelTest_TestLevelMonitoringLowBitrate_Test_01088db8;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__LevelTest_TestLevelMonitoringLowBitrate_Test_01088dd8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }